

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

void Cmd_dumplinktable(FCommandLine *argv,APlayerPawn *who,int key)

{
  FDisplacement *pFVar1;
  FDisplacement *disp;
  int local_20;
  int y;
  int x;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  for (local_20 = 1; local_20 < Displacements.size; local_20 = local_20 + 1) {
    for (disp._4_4_ = 1; disp._4_4_ < Displacements.size; disp._4_4_ = disp._4_4_ + 1) {
      pFVar1 = FDisplacementTable::operator()(&Displacements,local_20,disp._4_4_);
      Printf("%c%c(%6d, %6d)",0x1c,(ulong)(pFVar1->indirect + 0x43),
             (ulong)(uint)(int)(pFVar1->pos).X,(ulong)(uint)(int)(pFVar1->pos).Y);
    }
    Printf("\n");
  }
  return;
}

Assistant:

CCMD(dumplinktable)
{
	for (int x = 1; x < Displacements.size; x++)
	{
		for (int y = 1; y < Displacements.size; y++)
		{
			FDisplacement &disp = Displacements(x, y);
			Printf("%c%c(%6d, %6d)", TEXTCOLOR_ESCAPE, 'C' + disp.indirect, int(disp.pos.X), int(disp.pos.Y));
		}
		Printf("\n");
	}
}